

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  pointer ppSVar1;
  pointer ppcVar2;
  bool bVar3;
  pointer ppcVar4;
  ScopePool **funcScope;
  pointer ppSVar5;
  bool bVar6;
  bool bVar7;
  
  ppSVar1 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar5 = (this->FunctionScopes).
                 super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar7 = ppSVar5 != ppSVar1, bVar7;
      ppSVar5 = ppSVar5 + 1) {
    ppcVar4 = ((*ppSVar5)->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = ((*ppSVar5)->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar6 = ppcVar4 != ppcVar2;
    if (bVar6) {
      bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
      while (!bVar3) {
        ppcVar4 = ppcVar4 + 1;
        bVar6 = ppcVar4 != ppcVar2;
        if (ppcVar4 == ppcVar2) break;
        bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
      }
    }
    if (bVar6) {
      if (bVar7) {
        return true;
      }
      break;
    }
  }
  ppSVar5 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar7 = ppSVar5 != ppSVar1;
    if (!bVar7) {
LAB_002eff70:
      ppcVar4 = (this->ProcessScope).Locks.
                super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar2 = (this->ProcessScope).Locks.
                super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      bVar7 = ppcVar4 != ppcVar2;
      if (bVar7) {
        bVar6 = cmFileLock::IsLocked(*ppcVar4,filename);
        while (!bVar6) {
          ppcVar4 = ppcVar4 + 1;
          bVar7 = ppcVar4 != ppcVar2;
          if (ppcVar4 == ppcVar2) {
            return bVar7;
          }
          bVar6 = cmFileLock::IsLocked(*ppcVar4,filename);
        }
      }
      return bVar7;
    }
    ppcVar4 = ((*ppSVar5)->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = ((*ppSVar5)->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar6 = ppcVar4 != ppcVar2;
    if (bVar6) {
      bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
      while (!bVar3) {
        ppcVar4 = ppcVar4 + 1;
        bVar6 = ppcVar4 != ppcVar2;
        if (ppcVar4 == ppcVar2) break;
        bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
      }
    }
    if (bVar6) {
      if (bVar7) {
        return true;
      }
      goto LAB_002eff70;
    }
    ppSVar5 = ppSVar5 + 1;
  } while( true );
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (auto const& funcScope : this->FunctionScopes) {
    const bool result = funcScope->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (auto const& fileScope : this->FileScopes) {
    const bool result = fileScope->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}